

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cgltf.c
# Opt level: O2

cgltf_result cgltf_validate(cgltf_data *data)

{
  cgltf_node **ppcVar1;
  cgltf_component_type cVar2;
  cgltf_accessor *pcVar3;
  cgltf_buffer_view *pcVar4;
  ulong *puVar5;
  cgltf_mesh *pcVar6;
  cgltf_primitive *pcVar7;
  cgltf_accessor *pcVar8;
  cgltf_animation_channel *pcVar9;
  long *plVar10;
  cgltf_size cVar11;
  cgltf_size cVar12;
  cgltf_size i_1;
  cgltf_node *pcVar13;
  cgltf_size j;
  cgltf_size cVar14;
  cgltf_node *pcVar15;
  cgltf_accessor **ppcVar16;
  cgltf_node *pcVar17;
  cgltf_size cVar18;
  long lVar19;
  long lVar20;
  cgltf_size cVar21;
  cgltf_size i;
  long lVar22;
  bool bVar23;
  
  cVar21 = data->accessors_count;
  lVar22 = 0xe8;
  while (bVar23 = cVar21 != 0, cVar21 = cVar21 - 1, bVar23) {
    pcVar3 = data->accessors;
    cVar11 = cgltf_calc_size(*(cgltf_type *)((long)pcVar3 + lVar22 + -0xe0),
                             *(cgltf_component_type *)((long)pcVar3 + lVar22 + -0xe8));
    lVar19 = *(long *)((long)pcVar3 + lVar22 + -0xc0);
    if ((lVar19 != 0) &&
       (*(ulong *)(lVar19 + 0x10) <
        *(long *)((long)pcVar3 + lVar22 + -0xd8) + cVar11 +
        (*(long *)((long)pcVar3 + lVar22 + -0xd0) + -1) * *(long *)((long)pcVar3 + lVar22 + -200)))
    {
      return cgltf_result_data_too_short;
    }
    if (*(int *)((long)pcVar3->min + lVar22 + -100) != 0) {
      cVar2 = *(cgltf_component_type *)((long)pcVar3->min + lVar22 + -0x44);
      cVar12 = cgltf_calc_size(cgltf_type_scalar,cVar2);
      cVar18 = *(cgltf_size *)((long)pcVar3->min + lVar22 + -0x4c);
      cVar14 = *(cgltf_size *)((long)pcVar3->min + lVar22 + -0x5c);
      pcVar4 = *(cgltf_buffer_view **)((long)pcVar3->min + lVar22 + -0x54);
      if (pcVar4->size < cVar12 * cVar14 + cVar18) {
        return cgltf_result_data_too_short;
      }
      if (*(ulong *)(*(long *)((long)pcVar3->min + lVar22 + -0x3c) + 0x10) <
          cVar11 * cVar14 + *(long *)((long)pcVar3->min + lVar22 + -0x34)) {
        return cgltf_result_data_too_short;
      }
      if (cgltf_component_type_r_32u < cVar2) {
        return cgltf_result_invalid_gltf;
      }
      if ((0x34U >> (cVar2 & 0x1f) & 1) == 0) {
        return cgltf_result_invalid_gltf;
      }
      if ((pcVar4->buffer->data != (void *)0x0) &&
         (cVar11 = cgltf_calc_index_bound(pcVar4,cVar18,cVar2,cVar14),
         *(ulong *)((long)pcVar3 + lVar22 + -0xd0) <= cVar11)) {
        return cgltf_result_data_too_short;
      }
    }
    lVar22 = lVar22 + 0x130;
  }
  cVar21 = data->buffer_views_count;
  lVar22 = 0x10;
  while (bVar23 = cVar21 != 0, cVar21 = cVar21 - 1, bVar23) {
    pcVar4 = data->buffer_views;
    puVar5 = *(ulong **)((long)pcVar4 + lVar22 + -0x10);
    if ((puVar5 != (ulong *)0x0) &&
       (*puVar5 < (ulong)(*(long *)((long)&pcVar4->buffer + lVar22) +
                         *(long *)((long)pcVar4 + lVar22 + -8)))) {
      return cgltf_result_data_too_short;
    }
    lVar22 = lVar22 + 0x38;
  }
  cVar21 = data->meshes_count;
  for (cVar11 = 0; cVar11 != cVar21; cVar11 = cVar11 + 1) {
    pcVar6 = data->meshes;
    if (((pcVar6[cVar11].weights != (cgltf_float *)0x0) && (pcVar6[cVar11].primitives_count != 0))
       && ((pcVar6[cVar11].primitives)->targets_count != pcVar6[cVar11].weights_count)) {
      return cgltf_result_invalid_gltf;
    }
    cVar18 = pcVar6[cVar11].primitives_count;
    if (pcVar6[cVar11].target_names != (char **)0x0) {
      if (cVar18 == 0) {
        cVar18 = 0;
      }
      else if ((pcVar6[cVar11].primitives)->targets_count != pcVar6[cVar11].target_names_count) {
        return cgltf_result_invalid_gltf;
      }
    }
    for (cVar14 = 0; cVar14 != cVar18; cVar14 = cVar14 + 1) {
      pcVar7 = pcVar6[cVar11].primitives;
      if (pcVar7[cVar14].targets_count != pcVar7->targets_count) {
        return cgltf_result_invalid_gltf;
      }
      if (pcVar7[cVar14].attributes_count != 0) {
        pcVar3 = (pcVar7[cVar14].attributes)->data;
        ppcVar16 = &(pcVar7[cVar14].attributes)->data;
        lVar22 = pcVar7[cVar14].attributes_count + 1;
        while (lVar22 = lVar22 + -1, lVar22 != 0) {
          pcVar8 = *ppcVar16;
          ppcVar16 = ppcVar16 + 3;
          if (pcVar8->count != pcVar3->count) {
            return cgltf_result_invalid_gltf;
          }
        }
        for (cVar12 = 0; cVar12 != pcVar7[cVar14].targets_count; cVar12 = cVar12 + 1) {
          lVar19 = pcVar7[cVar14].targets[cVar12].attributes_count + 1;
          lVar22 = 0x10;
          while (lVar19 = lVar19 + -1, lVar19 != 0) {
            plVar10 = (long *)((long)&(pcVar7[cVar14].targets[cVar12].attributes)->name + lVar22);
            lVar22 = lVar22 + 0x18;
            if (*(cgltf_size *)(*plVar10 + 0x18) != pcVar3->count) {
              return cgltf_result_invalid_gltf;
            }
          }
        }
        pcVar8 = pcVar7[cVar14].indices;
        if (pcVar8 != (cgltf_accessor *)0x0) {
          cVar2 = pcVar8->component_type;
          if (cgltf_component_type_r_32u < cVar2) {
            return cgltf_result_invalid_gltf;
          }
          if ((0x34U >> (cVar2 & 0x1f) & 1) == 0) {
            return cgltf_result_invalid_gltf;
          }
          pcVar4 = pcVar8->buffer_view;
          if (((pcVar4 != (cgltf_buffer_view *)0x0) && (pcVar4->buffer->data != (void *)0x0)) &&
             (cVar12 = cgltf_calc_index_bound(pcVar4,pcVar8->offset,cVar2,pcVar8->count),
             pcVar3->count <= cVar12)) {
            return cgltf_result_data_too_short;
          }
        }
      }
    }
  }
  lVar22 = 0x48;
  cVar21 = data->nodes_count;
  while (bVar23 = cVar21 != 0, cVar21 = cVar21 - 1, bVar23) {
    pcVar13 = data->nodes;
    if ((((*(long *)((long)pcVar13->translation + lVar22 + -0x68) != 0) &&
         (lVar19 = *(long *)((long)pcVar13->translation + lVar22 + -0x80), lVar19 != 0)) &&
        (*(long *)(lVar19 + 0x10) != 0)) &&
       (*(long *)(*(long *)(lVar19 + 8) + 0x30) !=
        *(long *)((long)pcVar13->translation + lVar22 + -0x60))) {
      return cgltf_result_invalid_gltf;
    }
    lVar22 = lVar22 + 0xd8;
  }
  cVar21 = 0;
LAB_00271921:
  if (cVar21 == data->nodes_count) {
    for (cVar21 = 0; cVar21 != data->scenes_count; cVar21 = cVar21 + 1) {
      cVar11 = 0;
      while (data->scenes[cVar21].nodes_count != cVar11) {
        ppcVar1 = data->scenes[cVar21].nodes + cVar11;
        cVar11 = cVar11 + 1;
        if ((*ppcVar1)->parent != (cgltf_node *)0x0) {
          return cgltf_result_invalid_gltf;
        }
      }
    }
    cVar21 = 0;
    do {
      if (cVar21 == data->animations_count) {
        return cgltf_result_success;
      }
      cVar11 = data->animations[cVar21].channels_count;
      lVar22 = 0x10;
      while (bVar23 = cVar11 != 0, cVar11 = cVar11 - 1, bVar23) {
        pcVar9 = data->animations[cVar21].channels;
        lVar19 = *(long *)((long)pcVar9 + lVar22 + -8);
        if (lVar19 != 0) {
          lVar20 = 1;
          if (*(int *)((long)&pcVar9->sampler + lVar22) == 4) {
            lVar19 = *(long *)(lVar19 + 0x28);
            if (lVar19 == 0) {
              return cgltf_result_invalid_gltf;
            }
            if (*(long *)(lVar19 + 0x10) == 0) {
              return cgltf_result_invalid_gltf;
            }
            lVar20 = *(long *)(*(long *)(lVar19 + 8) + 0x30);
          }
          plVar10 = *(long **)((long)pcVar9 + lVar22 + -0x10);
          if (lVar20 * *(long *)(*plVar10 + 0x18) * ((ulong)((int)plVar10[2] == 2) * 2 + 1) -
              *(long *)(plVar10[1] + 0x18) != 0) {
            return cgltf_result_data_too_short;
          }
        }
        lVar22 = lVar22 + 0x28;
      }
      cVar21 = cVar21 + 1;
    } while( true );
  }
  pcVar13 = data->nodes[cVar21].parent;
  pcVar17 = pcVar13;
  if (pcVar13 == (cgltf_node *)0x0) {
    pcVar15 = (cgltf_node *)0x0;
    goto LAB_00271948;
  }
  do {
    pcVar15 = pcVar17->parent;
LAB_00271948:
    do {
      if ((pcVar13 == (cgltf_node *)0x0) || (pcVar15 == (cgltf_node *)0x0)) {
        cVar21 = cVar21 + 1;
        goto LAB_00271921;
      }
      if (pcVar13 == pcVar15) {
        return cgltf_result_invalid_gltf;
      }
      pcVar13 = pcVar13->parent;
      ppcVar1 = &pcVar15->parent;
      pcVar15 = (cgltf_node *)0x0;
      pcVar17 = *ppcVar1;
    } while (*ppcVar1 == (cgltf_node *)0x0);
  } while( true );
}

Assistant:

cgltf_result cgltf_validate(cgltf_data* data)
{
    for (cgltf_size i = 0; i < data->accessors_count; ++i)
    {
        cgltf_accessor* accessor = &data->accessors[i];

        cgltf_size element_size = cgltf_calc_size(accessor->type, accessor->component_type);

        if (accessor->buffer_view)
        {
            cgltf_size req_size = accessor->offset + accessor->stride * (accessor->count - 1) + element_size;

            if (accessor->buffer_view->size < req_size)
            {
                return cgltf_result_data_too_short;
            }
        }

        if (accessor->is_sparse)
        {
            cgltf_accessor_sparse* sparse = &accessor->sparse;

            cgltf_size indices_component_size = cgltf_calc_size(cgltf_type_scalar, sparse->indices_component_type);
            cgltf_size indices_req_size = sparse->indices_byte_offset + indices_component_size * sparse->count;
            cgltf_size values_req_size = sparse->values_byte_offset + element_size * sparse->count;

            if (sparse->indices_buffer_view->size < indices_req_size ||
                sparse->values_buffer_view->size < values_req_size)
            {
                return cgltf_result_data_too_short;
            }

            if (sparse->indices_component_type != cgltf_component_type_r_8u &&
                sparse->indices_component_type != cgltf_component_type_r_16u &&
                sparse->indices_component_type != cgltf_component_type_r_32u)
            {
                return cgltf_result_invalid_gltf;
            }

            if (sparse->indices_buffer_view->buffer->data)
            {
                cgltf_size index_bound = cgltf_calc_index_bound(sparse->indices_buffer_view, sparse->indices_byte_offset, sparse->indices_component_type, sparse->count);

                if (index_bound >= accessor->count)
                {
                    return cgltf_result_data_too_short;
                }
            }
        }
    }

    for (cgltf_size i = 0; i < data->buffer_views_count; ++i)
    {
        cgltf_size req_size = data->buffer_views[i].offset + data->buffer_views[i].size;

        if (data->buffer_views[i].buffer && data->buffer_views[i].buffer->size < req_size)
        {
            return cgltf_result_data_too_short;
        }
    }

    for (cgltf_size i = 0; i < data->meshes_count; ++i)
    {
        if (data->meshes[i].weights)
        {
            if (data->meshes[i].primitives_count && data->meshes[i].primitives[0].targets_count != data->meshes[i].weights_count)
            {
                return cgltf_result_invalid_gltf;
            }
        }

        if (data->meshes[i].target_names)
        {
            if (data->meshes[i].primitives_count && data->meshes[i].primitives[0].targets_count != data->meshes[i].target_names_count)
            {
                return cgltf_result_invalid_gltf;
            }
        }

        for (cgltf_size j = 0; j < data->meshes[i].primitives_count; ++j)
        {
            if (data->meshes[i].primitives[j].targets_count != data->meshes[i].primitives[0].targets_count)
            {
                return cgltf_result_invalid_gltf;
            }

            if (data->meshes[i].primitives[j].attributes_count)
            {
                cgltf_accessor* first = data->meshes[i].primitives[j].attributes[0].data;

                for (cgltf_size k = 0; k < data->meshes[i].primitives[j].attributes_count; ++k)
                {
                    if (data->meshes[i].primitives[j].attributes[k].data->count != first->count)
                    {
                        return cgltf_result_invalid_gltf;
                    }
                }

                for (cgltf_size k = 0; k < data->meshes[i].primitives[j].targets_count; ++k)
                {
                    for (cgltf_size m = 0; m < data->meshes[i].primitives[j].targets[k].attributes_count; ++m)
                    {
                        if (data->meshes[i].primitives[j].targets[k].attributes[m].data->count != first->count)
                        {
                            return cgltf_result_invalid_gltf;
                        }
                    }
                }

                cgltf_accessor* indices = data->meshes[i].primitives[j].indices;

                if (indices &&
                    indices->component_type != cgltf_component_type_r_8u &&
                    indices->component_type != cgltf_component_type_r_16u &&
                    indices->component_type != cgltf_component_type_r_32u)
                {
                    return cgltf_result_invalid_gltf;
                }

                if (indices && indices->buffer_view && indices->buffer_view->buffer->data)
                {
                    cgltf_size index_bound = cgltf_calc_index_bound(indices->buffer_view, indices->offset, indices->component_type, indices->count);

                    if (index_bound >= first->count)
                    {
                        return cgltf_result_data_too_short;
                    }
                }
            }
        }
    }

    for (cgltf_size i = 0; i < data->nodes_count; ++i)
    {
        if (data->nodes[i].weights && data->nodes[i].mesh)
        {
            if (data->nodes[i].mesh->primitives_count && data->nodes[i].mesh->primitives[0].targets_count != data->nodes[i].weights_count)
            {
                return cgltf_result_invalid_gltf;
            }
        }
    }

    for (cgltf_size i = 0; i < data->nodes_count; ++i)
    {
        cgltf_node* p1 = data->nodes[i].parent;
        cgltf_node* p2 = p1 ? p1->parent : NULL;

        while (p1 && p2)
        {
            if (p1 == p2)
            {
                return cgltf_result_invalid_gltf;
            }

            p1 = p1->parent;
            p2 = p2->parent ? p2->parent->parent : NULL;
        }
    }

    for (cgltf_size i = 0; i < data->scenes_count; ++i)
    {
        for (cgltf_size j = 0; j < data->scenes[i].nodes_count; ++j)
        {
            if (data->scenes[i].nodes[j]->parent)
            {
                return cgltf_result_invalid_gltf;
            }
        }
    }

    for (cgltf_size i = 0; i < data->animations_count; ++i)
    {
        for (cgltf_size j = 0; j < data->animations[i].channels_count; ++j)
        {
            cgltf_animation_channel* channel = &data->animations[i].channels[j];

            if (!channel->target_node)
            {
                continue;
            }

            cgltf_size components = 1;

            if (channel->target_path == cgltf_animation_path_type_weights)
            {
                if (!channel->target_node->mesh || !channel->target_node->mesh->primitives_count)
                {
                    return cgltf_result_invalid_gltf;
                }

                components = channel->target_node->mesh->primitives[0].targets_count;
            }

            cgltf_size values = channel->sampler->interpolation == cgltf_interpolation_type_cubic_spline ? 3 : 1;

            if (channel->sampler->input->count * components * values != channel->sampler->output->count)
            {
                return cgltf_result_data_too_short;
            }
        }
    }

    return cgltf_result_success;
}